

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O3

void __thiscall osqp::anon_unknown_0::TwoDimensionalQpTest::SetUp(TwoDimensionalQpTest *this)

{
  double *pdVar1;
  undefined8 *puVar2;
  pointer *__ptr;
  char *in_R9;
  Triplet<double,_int> kTripletsA [1];
  OsqpInstance instance;
  SparseMatrix<double,_0,_int> constraint_matrix;
  SparseMatrix<double,_0,_int> objective_matrix;
  Triplet<double,_int> kTripletsP [4];
  AssertHelper AStack_298;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_290;
  string local_288;
  internal local_268 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_258;
  undefined8 local_250;
  undefined1 local_248 [24];
  StorageIndex *pSStack_230;
  StorageIndex *local_228;
  CompressedStorage<double,_long_long> CStack_220;
  Matrix<double,__1,_1,_0,__1,_1> local_200;
  SparseMatrix<double,_0,_long_long> local_1f0;
  undefined8 *local_1a8;
  long lStack_1a0;
  undefined8 *local_198;
  long lStack_190;
  SparseMatrix<double,_0,_int> local_188;
  SparseMatrix<double,_0,_int> local_140;
  OsqpSettings local_f8;
  double local_58 [8];
  
  local_140.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>)false;
  local_140.m_outerSize = 0;
  local_140.m_innerSize = 0;
  local_140.m_outerIndex = (StorageIndex *)0x0;
  local_140.m_innerNonZeros = (StorageIndex *)0x0;
  local_140.m_data.m_values = (Scalar *)0x0;
  local_140.m_data.m_indices = (StorageIndex_conflict *)0x0;
  local_140.m_data.m_size = 0;
  local_140.m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_0,_int>::resize(&local_140,2,2);
  local_248._0_8_ = local_58;
  local_58[0] = 0.0;
  local_58[1] = 2.0;
  local_58[2] = 4.94065645841247e-324;
  local_58[3] = 0.5;
  local_58[4] = 2.12199579096527e-314;
  local_58[5] = 0.5;
  local_58[6] = 2.12199579145934e-314;
  local_58[7] = 2.0;
  local_f8.rho = (double)&stack0xffffffffffffffe8;
  Eigen::internal::
  set_from_triplets<Eigen::Triplet<double,int>const*,Eigen::SparseMatrix<double,0,int>,Eigen::internal::scalar_sum_op<double,double>>
            (local_248,&local_f8,&local_140,&local_188);
  local_188.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>)false;
  local_188.m_outerSize = 0;
  local_188.m_innerSize = 0;
  local_188.m_outerIndex = (StorageIndex *)0x0;
  local_188.m_innerNonZeros = (StorageIndex *)0x0;
  local_188.m_data.m_values = (Scalar *)0x0;
  local_188.m_data.m_indices = (StorageIndex_conflict *)0x0;
  local_188.m_data.m_size = 0;
  local_188.m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_0,_int>::resize(&local_188,1,2);
  local_248._0_8_ = &local_258;
  local_258 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_250 = 0x3ff0000000000000;
  local_f8.rho = (double)local_248;
  Eigen::internal::
  set_from_triplets<Eigen::Triplet<double,int>const*,Eigen::SparseMatrix<double,0,int>,Eigen::internal::scalar_sum_op<double,double>>
            (local_248,&local_f8,&local_188,&local_288);
  local_248._0_8_ = local_248._0_8_ & 0xffffffffffffff00;
  local_248._8_8_ = -NAN;
  local_248._16_8_ = 0;
  pSStack_230 = (StorageIndex *)0x0;
  local_228 = (StorageIndex *)0x0;
  CStack_220.m_values = (Scalar *)0x0;
  CStack_220.m_indices = (StorageIndex *)0x0;
  CStack_220.m_size = 0;
  CStack_220.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_0,_long_long>::resize
            ((SparseMatrix<double,_0,_long_long> *)local_248,0,0);
  local_200.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_200.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_1f0.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_long_long>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_long_long>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_long_long>_>)false;
  local_1f0.m_outerSize = -1;
  local_1f0.m_innerSize = 0;
  local_1f0.m_outerIndex = (StorageIndex *)0x0;
  local_1f0.m_innerNonZeros = (StorageIndex *)0x0;
  local_1f0.m_data.m_values = (Scalar *)0x0;
  local_1f0.m_data.m_indices = (StorageIndex *)0x0;
  local_1f0.m_data.m_size = 0;
  local_1f0.m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_0,_long_long>::resize(&local_1f0,0,0);
  local_198 = (undefined8 *)0x0;
  lStack_190 = 0;
  local_1a8 = (undefined8 *)0x0;
  lStack_1a0 = 0;
  Eigen::SparseMatrix<double,0,long_long>::operator=
            ((SparseMatrix<double,0,long_long> *)local_248,
             (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)&local_140);
  pdVar1 = local_200.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
  ;
  if ((double)local_200.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows != 9.88131291682493e-324) {
    free(local_200.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    pdVar1 = (double *)malloc(0x10);
    if (((ulong)pdVar1 & 0xf) != 0) {
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                    "void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (pdVar1 == (double *)0x0) goto LAB_0011f875;
  }
  local_200.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = pdVar1
  ;
  local_f8.rho = (double)&local_200;
  local_200.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 2;
  local_f8.sigma = 0.0;
  local_f8.scaling = 1;
  local_f8._24_8_ = 1;
  *local_200.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = 0.0;
  local_288._M_dataplus._M_p = (pointer)0x0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_f8,
             (Scalar *)&local_288);
  if ((local_f8._24_8_ + (long)local_f8.sigma !=
       (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_f8.rho)->m_storage).
       m_rows) || (local_f8.scaling != 1)) {
    __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                  ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  Eigen::SparseMatrix<double,0,long_long>::operator=
            ((SparseMatrix<double,0,long_long> *)&local_1f0,
             (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)&local_188);
  puVar2 = local_1a8;
  if (lStack_1a0 != 1) {
    free(local_1a8);
    puVar2 = (undefined8 *)malloc(8);
    if (puVar2 == (undefined8 *)0x0) goto LAB_0011f875;
  }
  local_1a8 = puVar2;
  lStack_1a0 = 1;
  *local_1a8 = 0x3ff0000000000000;
  puVar2 = local_198;
  if (lStack_190 != 1) {
    free(local_198);
    puVar2 = (undefined8 *)malloc(8);
    if (puVar2 == (undefined8 *)0x0) {
LAB_0011f875:
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = execv;
      __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  local_198 = puVar2;
  lStack_190 = 1;
  *local_198 = 0x7ff0000000000000;
  OsqpSettings::OsqpSettings(&local_f8);
  local_f8.eps_abs = 1.0000000000000002e-06;
  local_f8.eps_rel = 0.0;
  local_f8.check_termination = 1;
  OsqpSolver::Init((OsqpSolver *)&local_288,(OsqpInstance *)&this->solver_,(OsqpSettings *)local_248
                  );
  local_268[0] = (internal)((StatusRep *)local_288._M_dataplus._M_p == (StatusRep *)0x1);
  local_260 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (((ulong)local_288._M_dataplus._M_p & 1) == 0) {
    absl::status_internal::StatusRep::Unref((StatusRep *)local_288._M_dataplus._M_p);
    if (((byte)local_268[0] & 1) != 0) goto LAB_0011f7b9;
  }
  else if ((StatusRep *)local_288._M_dataplus._M_p == (StatusRep *)0x1) goto LAB_0011f7b9;
  testing::Message::Message((Message *)&local_290);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_288,local_268,(AssertionResult *)"solver_.Init(instance, settings).ok()","false"
             ,"true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_298,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
             ,0x145,local_288._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&AStack_298,(Message *)&local_290);
  testing::internal::AssertHelper::~AssertHelper(&AStack_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if (local_290._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_290._M_head_impl + 8))();
  }
LAB_0011f7b9:
  if (local_260 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_260,local_260);
  }
  free(local_198);
  free(local_1a8);
  free(local_1f0.m_outerIndex);
  free(local_1f0.m_innerNonZeros);
  Eigen::internal::CompressedStorage<double,_long_long>::~CompressedStorage(&local_1f0.m_data);
  free(local_200.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(pSStack_230);
  free(local_228);
  Eigen::internal::CompressedStorage<double,_long_long>::~CompressedStorage(&CStack_220);
  free(local_188.m_outerIndex);
  free(local_188.m_innerNonZeros);
  Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_188.m_data);
  free(local_140.m_outerIndex);
  free(local_140.m_innerNonZeros);
  Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_140.m_data);
  return;
}

Assistant:

void SetUp() override {
    // Minimize x^2 + (1/2)xy + y^2 subject to x >= 1.
    SparseMatrix<double> objective_matrix(2, 2);
    const Triplet<double> kTripletsP[] = {
        {0, 0, 2.0}, {1, 0, 0.5}, {0, 1, 0.5}, {1, 1, 2.0}};
    objective_matrix.setFromTriplets(std::begin(kTripletsP),
                                     std::end(kTripletsP));

    SparseMatrix<double> constraint_matrix(1, 2);
    const Triplet<double> kTripletsA[] = {{0, 0, 1.0}};
    constraint_matrix.setFromTriplets(std::begin(kTripletsA),
                                      std::end(kTripletsA));

    OsqpInstance instance;
    instance.objective_matrix = objective_matrix;
    instance.objective_vector.resize(2);
    instance.objective_vector << 0.0, 0.0;
    instance.constraint_matrix = constraint_matrix;
    instance.lower_bounds.resize(1);
    instance.lower_bounds << 1.0;
    instance.upper_bounds.resize(1);
    instance.upper_bounds << kInfinity;

    OsqpSettings settings;
    settings.eps_abs = kTolerance / 10;
    settings.eps_rel = 0.0;
    // check_termination is set so that the warm-started instance converges
    // immediately.
    settings.check_termination = 1;
    ASSERT_TRUE(solver_.Init(instance, settings).ok());
  }